

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O1

Status __thiscall
soplex::SLUFactorRational::load(SLUFactorRational *this,SVectorRational **matrix,int dm)

{
  U *pUVar1;
  Col *pCVar2;
  Status SVar3;
  bool bVar4;
  int iVar5;
  Rational last;
  Rational better;
  Rational lastStability;
  data_type local_1d8;
  char local_1c3;
  char local_1c2;
  data_type local_1b8;
  char local_1a3;
  char local_1a2;
  SVectorRational **local_190;
  data_type local_188;
  char local_173;
  char local_172;
  data_type local_168;
  char local_153;
  char local_152;
  longdouble local_144;
  data_type local_138;
  char local_123;
  char local_122;
  uint local_118;
  void *local_110;
  char local_103;
  char local_102;
  data_type local_f8;
  char local_e3;
  char local_e2;
  uint local_d8;
  void *local_d0;
  char local_c3;
  char local_c2;
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  data_type local_58;
  char local_43;
  char local_42;
  
  (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[6])(&local_f8,this);
  pUVar1 = &(this->super_CLUFactorRational).u;
  (this->super_CLUFactorRational).u.row.list.next = (Dring *)pUVar1;
  (this->super_CLUFactorRational).u.row.list.prev = (Dring *)pUVar1;
  pCVar2 = &(this->super_CLUFactorRational).u.col;
  (this->super_CLUFactorRational).u.col.list.next = &pCVar2->list;
  (this->super_CLUFactorRational).u.col.list.prev = &pCVar2->list;
  this->usetup = false;
  (this->super_CLUFactorRational).l.updateType = this->uptype;
  (this->super_CLUFactorRational).l.firstUpdate = 0;
  (this->super_CLUFactorRational).l.firstUnused = 0;
  local_190 = matrix;
  if ((this->super_CLUFactorRational).thedim == dm) {
    local_144 = (longdouble)0.08;
    local_1d8.ld.capacity = SUB104(local_144,0);
    local_1d8.la[0]._4_4_ = (undefined4)((unkuint10)local_144 >> 0x20);
    local_1d8.la[1]._0_2_ = (undefined2)((unkuint10)local_144 >> 0x40);
    bVar4 = boost::multiprecision::default_ops::
            eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_f8.ld,(longdouble *)&local_1d8,(true_ *)&local_188.ld);
    if (bVar4) {
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_1d8.ld,&(this->minThreshold).m_backend);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_138.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_1d8.ld);
      betterThreshold((Rational *)&local_188.ld,(Rational *)&local_138.ld);
      if ((local_103 == '\0') && (local_102 == '\0')) {
        operator_delete(local_110,(ulong)local_118 << 3);
      }
      if ((local_123 == '\0') && (local_122 == '\0')) {
        operator_delete(local_138.ld.data,(ulong)local_138.ld.capacity << 3);
      }
      while( true ) {
        iVar5 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_188.ld,&(this->lastThreshold).m_backend);
        if (-1 < iVar5) break;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1d8.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_188.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1b8.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_168.ld);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_b8.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_1d8.ld);
        betterThreshold((Rational *)&local_78.ld,(Rational *)&local_b8.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_188.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_78.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_168.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_58.ld);
        if ((local_43 == '\0') && (local_42 == '\0')) {
          operator_delete(local_58.ld.data,(ulong)local_58.ld.capacity << 3);
        }
        if ((local_63 == '\0') && (local_62 == '\0')) {
          operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
        }
        if ((local_83 == '\0') && (local_82 == '\0')) {
          operator_delete(local_90,(ulong)local_98 << 3);
        }
        if ((local_a3 == '\0') && (local_a2 == '\0')) {
          operator_delete(local_b8.ld.data,(ulong)local_b8.ld.capacity << 3);
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&this->lastThreshold,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_1d8.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&(this->lastThreshold).m_backend.m_value.den,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_1b8.ld);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->minStability,local_144);
      if ((local_153 == '\0') && (local_152 == '\0')) {
        operator_delete(local_168.ld.data,(ulong)local_168.ld.capacity << 3);
      }
      if ((local_173 == '\0') && (local_172 == '\0')) {
        operator_delete(local_188.ld.data,(ulong)local_188.ld.capacity << 3);
      }
      if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
        operator_delete(local_1b8.ld.data,(ulong)local_1b8.ld.capacity << 3);
      }
      if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
        operator_delete((void *)CONCAT62(local_1d8.la[1]._2_6_,local_1d8.la[1]._0_2_),
                        (ulong)local_1d8.ld.capacity << 3);
      }
    }
  }
  else {
    (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[2])(this);
    (this->super_CLUFactorRational).thedim = dm;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->vec,dm,true);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->ssvec,(this->super_CLUFactorRational).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->eta,(this->super_CLUFactorRational).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->forest,(this->super_CLUFactorRational).thedim);
    (this->super_CLUFactorRational).work =
         (this->vec).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    spx_realloc<int*>(&(this->super_CLUFactorRational).row.perm,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).row.orig,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).col.perm,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).col.orig,
                      (this->super_CLUFactorRational).thedim);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&(this->super_CLUFactorRational).diag,(this->super_CLUFactorRational).thedim,true);
    spx_realloc<soplex::CLUFactorRational::Dring*>
              (&(this->super_CLUFactorRational).u.row.elem,(this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.len,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.max,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.start,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<soplex::CLUFactorRational::Dring*>
              (&(this->super_CLUFactorRational).u.col.elem,(this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.len,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.max,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.start,
                      (this->super_CLUFactorRational).thedim + 1);
    iVar5 = (this->super_CLUFactorRational).thedim + 1000;
    (this->super_CLUFactorRational).l.startSize = iVar5;
    spx_realloc<int*>(&(this->super_CLUFactorRational).l.row,iVar5);
    spx_realloc<int*>(&(this->super_CLUFactorRational).l.start,
                      (this->super_CLUFactorRational).l.startSize);
  }
  iVar5 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.row.list.idx = iVar5;
  (this->super_CLUFactorRational).u.row.start[iVar5] = 0;
  (this->super_CLUFactorRational).u.row.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.row.len[(this->super_CLUFactorRational).thedim] = 0;
  iVar5 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.col.list.idx = iVar5;
  (this->super_CLUFactorRational).u.col.start[iVar5] = 0;
  (this->super_CLUFactorRational).u.col.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.col.len[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).stat = OK;
  CLUFactorRational::factor(&this->super_CLUFactorRational,local_190,&this->lastThreshold);
  (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[6])(&local_1d8,this);
  if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
    operator_delete(local_1b8.ld.data,(ulong)local_1b8.ld.capacity << 3);
  }
  if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
    operator_delete((void *)CONCAT62(local_1d8.la[1]._2_6_,local_1d8.la[1]._0_2_),
                    (ulong)local_1d8.ld.capacity << 3);
  }
  SVar3 = (this->super_CLUFactorRational).stat;
  if ((local_c3 == '\0') && (local_c2 == '\0')) {
    operator_delete(local_d0,(ulong)local_d8 << 3);
  }
  if ((local_e3 == '\0') && (local_e2 == '\0')) {
    operator_delete(local_f8.ld.data,(ulong)local_f8.ld.capacity << 3);
  }
  return SVar3;
}

Assistant:

inline SLUFactorRational::Status SLUFactorRational::load(const SVectorRational* matrix[], int dm)
{
   assert(dm     >= 0);
   assert(matrix != nullptr);

   Rational lastStability = stability();

   initDR(u.row.list);
   initDR(u.col.list);

   usetup        = false;
   l.updateType  = uptype;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   if(dm != thedim)
   {
      clear();

      thedim = dm;
      vec.reDim(thedim);
      ssvec.reDim(thedim);
      eta.reDim(thedim);
      forest.reDim(thedim);
      work = vec.get_ptr();

      spx_realloc(row.perm, thedim);
      spx_realloc(row.orig, thedim);
      spx_realloc(col.perm, thedim);
      spx_realloc(col.orig, thedim);
      diag.reDim(thedim);

      spx_realloc(u.row.elem,  thedim);
      spx_realloc(u.row.len,   thedim + 1);
      spx_realloc(u.row.max,   thedim + 1);
      spx_realloc(u.row.start, thedim + 1);

      spx_realloc(u.col.elem,  thedim);
      spx_realloc(u.col.len,   thedim + 1);
      spx_realloc(u.col.max,   thedim + 1);
      spx_realloc(u.col.start, thedim + 1);

      l.startSize = thedim + SOPLEX_MAXUPDATES;

      spx_realloc(l.row,   l.startSize);
      spx_realloc(l.start, l.startSize);
   }
   // the last factorization was reasonably stable, so we decrease the Markowitz threshold (stored in lastThreshold) in
   // order favour sparsity
   else if(lastStability > 2.0 * SOPLEX_MINSTABILITYRAT)
   {
      // we reset lastThreshold to its previous value in the sequence minThreshold, betterThreshold(minThreshold),
      // betterThreshold(betterThreshold(minThreshold)), ...
      Rational last   = minThreshold;
      Rational better = betterThreshold(last);

      while(better < lastThreshold)
      {
         last   = better;
         better = betterThreshold(last);
      }

      lastThreshold = last;

      // we reset the minimum stability (which might have been decreased below) to ensure that the increased sparsity
      // does not hurt the stability
      minStability  = 2 * SOPLEX_MINSTABILITYRAT;
   }

   u.row.list.idx      = thedim;
   u.row.start[thedim] = 0;
   u.row.max[thedim]   = 0;
   u.row.len[thedim]   = 0;

   u.col.list.idx      = thedim;
   u.col.start[thedim] = 0;
   u.col.max[thedim]   = 0;
   u.col.len[thedim]   = 0;

   stat = OK;
   factor(matrix, lastThreshold);


   SPxOut::debug(this, "DSLUFA02 threshold = {}\tstability = {}\tSOPLEX_MINSTABILITYRAT = {}\n",
                 lastThreshold, stability(), SOPLEX_MINSTABILITYRAT);
   SPX_DEBUG(
      int i;
      FILE* fl = fopen("dump.lp", "w");
      std::cout << "DSLUFA03 Basis:\n";
      int j = 0;

      for(i = 0; i < dim(); ++i)
      j += matrix[i]->size();
      for(i = 0; i < dim(); ++i)
   {
      for(j = 0; j < matrix[i]->size(); ++j)
            fprintf(fl, "%8d  %8d  %s\n",
                    i + 1, matrix[i]->index(j) + 1, matrix[i]->value(j).str());
      }
   fclose(fl);
   std::cout << "DSLUFA04 LU-Factors:" << std::endl;
             dump();

             std::cout << "DSLUFA05 threshold = " << lastThreshold
             << "\tstability = " << stability() << std::endl;
   )

   assert(isConsistent());
   return Status(stat);
}